

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_common.hpp
# Opt level: O0

void __thiscall
afsm::test::transit_action::operator()
          (transit_action *this,command_complete *param_1,
          inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
          *param_2,state<afsm::test::connection_pri_fsm_def::transaction::starting,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
                   *src,
          state<afsm::test::connection_pri_fsm_def::transaction::starting,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
          *tgt)

{
  ansi_color val;
  ostream *poVar1;
  string local_88 [48];
  string local_58 [36];
  int local_34;
  state<afsm::test::connection_pri_fsm_def::transaction::starting,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
  *local_30;
  state<afsm::test::connection_pri_fsm_def::transaction::starting,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
  *tgt_local;
  state<afsm::test::connection_pri_fsm_def::transaction::starting,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
  *src_local;
  inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
  *param_2_local;
  command_complete *param_1_local;
  transit_action *this_local;
  
  local_30 = tgt;
  tgt_local = src;
  src_local = (state<afsm::test::connection_pri_fsm_def::transaction::starting,_afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
               *)param_2;
  param_2_local =
       (inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
        *)param_1;
  param_1_local = (command_complete *)this;
  val = psst::operator|(cyan,bright);
  poVar1 = psst::operator<<((ostream *)&std::cerr,val);
  local_34 = (int)std::setw(0x11);
  poVar1 = std::operator<<(poVar1,(_Setw)local_34);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::left);
  poVar1 = std::operator<<(poVar1,(string *)events::command_complete::name_abi_cxx11_);
  poVar1 = psst::operator<<(poVar1,clear);
  poVar1 = std::operator<<(poVar1,": ");
  (*(tgt_local->super_state_base<afsm::test::connection_pri_fsm_def::transaction::starting>).
    super_type.super_starting.super_state<starting>.super_common_base<afsm::test::state_name>.
    super_state_name._vptr_state_name[2])();
  poVar1 = std::operator<<(poVar1,local_58);
  poVar1 = std::operator<<(poVar1," -> ");
  (*(local_30->super_state_base<afsm::test::connection_pri_fsm_def::transaction::starting>).
    super_type.super_starting.super_state<starting>.super_common_base<afsm::test::state_name>.
    super_state_name._vptr_state_name[2])(local_88);
  poVar1 = std::operator<<(poVar1,local_88);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void
    operator()(Event&&, FSM&, SourceState& src, TargetState& tgt) const
    {
        using ::psst::ansi_color;
        ::std::cerr
                << (ansi_color::cyan | ansi_color::bright)
                << ::std::setw(event_name_width) << ::std::left
                << Event::name << ansi_color::clear
                << ": " << src.name() << " -> " << tgt.name() << "\n";
    }